

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall
kj::ArrayBuilder<capnp::compiler::NodeTranslator::UnfinishedValue>::dispose
          (ArrayBuilder<capnp::compiler::NodeTranslator::UnfinishedValue> *this)

{
  UnfinishedValue *firstElement;
  RemoveConst<capnp::compiler::NodeTranslator::UnfinishedValue> *pRVar1;
  UnfinishedValue *pUVar2;
  UnfinishedValue *endCopy;
  UnfinishedValue *posCopy;
  UnfinishedValue *ptrCopy;
  ArrayBuilder<capnp::compiler::NodeTranslator::UnfinishedValue> *this_local;
  
  firstElement = this->ptr;
  pRVar1 = this->pos;
  pUVar2 = this->endPtr;
  if (firstElement != (UnfinishedValue *)0x0) {
    this->ptr = (UnfinishedValue *)0x0;
    this->pos = (RemoveConst<capnp::compiler::NodeTranslator::UnfinishedValue> *)0x0;
    this->endPtr = (UnfinishedValue *)0x0;
    ArrayDisposer::dispose<capnp::compiler::NodeTranslator::UnfinishedValue>
              (this->disposer,firstElement,((long)pRVar1 - (long)firstElement) / 0x90,
               ((long)pUVar2 - (long)firstElement) / 0x90);
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }